

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O3

vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *
wallet::coinselector_tests::GroupCoins
          (vector<wallet::COutput,_std::allocator<wallet::COutput>_> *available_coins,
          bool subtract_fee_outputs)

{
  OutputGroup *this;
  pointer pCVar1;
  pointer pOVar2;
  pointer pOVar3;
  pointer this_00;
  pointer __args;
  long in_FS_OFFSET;
  shared_ptr<wallet::COutput> local_50;
  undefined1 local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (GroupCoins(std::vector<wallet::COutput,std::allocator<wallet::COutput>>const&,bool)::
      static_groups == '\0') {
    GroupCoins();
  }
  pOVar3 = GroupCoins::static_groups.
           super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pOVar2 = GroupCoins::static_groups.
           super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
           super__Vector_impl_data._M_start;
  this_00 = GroupCoins::static_groups.
            super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (GroupCoins::static_groups.
      super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      GroupCoins::static_groups.
      super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
      super__Vector_impl_data._M_start) {
    do {
      std::
      vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>::
      ~vector(&this_00->m_outputs);
      this_00 = this_00 + 1;
    } while (this_00 != pOVar3);
    GroupCoins::static_groups.
    super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
    super__Vector_impl_data._M_finish = pOVar2;
  }
  __args = (available_coins->super__Vector_base<wallet::COutput,_std::allocator<wallet::COutput>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pCVar1 = (available_coins->super__Vector_base<wallet::COutput,_std::allocator<wallet::COutput>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (__args != pCVar1) {
    do {
      std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::emplace_back<>
                (&GroupCoins::static_groups);
      pOVar2 = GroupCoins::static_groups.
               super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl
               .super__Vector_impl_data._M_finish;
      this = GroupCoins::static_groups.
             super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
             super__Vector_impl_data._M_finish + -1;
      local_50.super___shared_ptr<wallet::COutput,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<wallet::COutput,std::allocator<wallet::COutput>,wallet::COutput_const&>
                (&local_50.super___shared_ptr<wallet::COutput,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(COutput **)&local_50,(allocator<wallet::COutput> *)&local_39,__args);
      OutputGroup::Insert(this,&local_50,0,0);
      if (local_50.super___shared_ptr<wallet::COutput,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_50.super___shared_ptr<wallet::COutput,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      pOVar2[-1].m_subtract_fee_outputs = subtract_fee_outputs;
      __args = __args + 1;
    } while (__args != pCVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return &GroupCoins::static_groups;
}

Assistant:

inline std::vector<OutputGroup>& GroupCoins(const std::vector<COutput>& available_coins, bool subtract_fee_outputs = false)
{
    static std::vector<OutputGroup> static_groups;
    static_groups.clear();
    for (auto& coin : available_coins) {
        static_groups.emplace_back();
        OutputGroup& group = static_groups.back();
        group.Insert(std::make_shared<COutput>(coin), /*ancestors=*/ 0, /*descendants=*/ 0);
        group.m_subtract_fee_outputs = subtract_fee_outputs;
    }
    return static_groups;
}